

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O0

bool __thiscall inja::Parser::parse_expression_not(Parser *this,Template *tmpl)

{
  basic_string_view<char,_std::char_traits<char>_> lhs;
  bool bVar1;
  bool local_41;
  type local_40;
  const_pointer local_30;
  size_type local_28;
  Template *local_20;
  Template *tmpl_local;
  Parser *this_local;
  
  local_41 = false;
  local_20 = tmpl;
  tmpl_local = (Template *)this;
  if ((this->m_tok).kind == Id) {
    local_30 = (this->m_tok).text.data_;
    local_28 = (this->m_tok).text.size_;
    nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_40,"not");
    lhs.size_ = local_28;
    lhs.data_ = local_30;
    local_41 = nonstd::sv_lite::operator==(lhs,local_40);
  }
  if (local_41 == false) {
    this_local._7_1_ = parse_expression_comparison(this,local_20);
  }
  else {
    get_next_token(this);
    bVar1 = parse_expression_not(this,local_20);
    if (bVar1) {
      append_function(this,local_20,Not,1);
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool parse_expression_not(Template& tmpl) {
		if (m_tok.kind == Token::Kind::Id && m_tok.text == "not") {
			get_next_token();
			if (!parse_expression_not(tmpl)) return false;
			append_function(tmpl, Bytecode::Op::Not, 1);
			return true;
		} else {
			return parse_expression_comparison(tmpl);
		}
	}